

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_bc81a::EdgeClippingLayer::Build(EdgeClippingLayer *this,Graph *g,S2Error *error)

{
  pointer *ppiVar1;
  CrossingInputEdge CVar2;
  undefined4 uVar3;
  vector<signed_char,_std::allocator<signed_char>_> *pvVar4;
  InputEdgeCrossings *pIVar5;
  pointer piVar6;
  iterator iVar7;
  iterator iVar8;
  pointer pVVar9;
  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
  *pvVar10;
  __uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> _Var11;
  void *pvVar12;
  byte bVar13;
  undefined8 uVar14;
  pointer pCVar15;
  pointer pCVar16;
  pointer pIVar17;
  pointer pIVar18;
  S2Error *pSVar19;
  Graph *pGVar20;
  CrossingInputEdge CVar21;
  bool bVar22;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *__cur;
  pointer pCVar23;
  AllocatorAndTag *pAVar24;
  const_reference pCVar25;
  long lVar26;
  pair<int,_int> pVar27;
  ostream *poVar28;
  int iVar29;
  CrossingGraphEdge *e;
  ulong uVar30;
  Rep *pRVar31;
  pair<int,_int> pVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  int *piVar36;
  pair<int,_int> *ppVar37;
  pointer ppVar38;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *__cur_1;
  ulong uVar39;
  pointer pCVar40;
  ulong uVar41;
  pair<int,_int> pVar42;
  GraphOptions *options;
  int iVar43;
  uint uVar44;
  long lVar45;
  char cVar46;
  uint uVar47;
  difference_type __d;
  ulong uVar48;
  CrossingGraphEdgeVector *__range1;
  ulong uVar49;
  pointer ppVar50;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *pIVar51;
  pointer this_00;
  Rep *pRVar52;
  undefined1 auVar53 [8];
  pointer pCVar54;
  int iVar55;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *this_01;
  double dVar56;
  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
  b_input_edges;
  vector<int,_std::allocator<int>_> a_vertices;
  vector<int,_std::allocator<int>_> indegree;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  b_edges;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vmap;
  IdSetLexicon new_input_edge_id_set_lexicon;
  vector<int,_std::allocator<int>_> a_num_crossings;
  pointer apiStackY_ef0 [14];
  pointer apiStackY_e80 [355];
  int local_358;
  uint local_354;
  char local_34d;
  CrossingInputEdge local_34c;
  ulong local_348;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *local_340;
  int local_334;
  double local_330;
  Rep *local_328;
  pointer local_320;
  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
  local_318;
  vector<int,_std::allocator<int>_> local_2f8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_2a8;
  EdgeClippingLayer *local_290;
  vector<int,_std::allocator<int>_> local_288;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  local_238;
  ulong local_220;
  undefined1 local_218 [8];
  pair<int,_int> *ppStack_210;
  pair<int,_int> *local_208;
  uint local_200;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_1f8;
  _Any_data local_1d0;
  _Manager_type local_1c0;
  vector<int,_std::allocator<int>_> local_1a8;
  S2Error *local_190;
  ulong local_188;
  int local_180;
  int local_17c;
  GraphEdgeClipper local_178;
  char *local_c8;
  Graph *local_c0;
  allocator_type *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  pointer local_90;
  long local_88 [2];
  vector<int,_std::allocator<int>_> local_78 [3];
  
  local_2a8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar4 = this->input_dimensions_;
  pIVar5 = this->input_crossings_;
  local_290 = this;
  local_190 = error;
  local_178.g_ = g;
  S2Builder::Graph::VertexInMap::VertexInMap(&local_178.in_,g);
  S2Builder::Graph::VertexOutMap::VertexOutMap(&local_178.out_,g);
  pGVar20 = local_178.g_;
  local_178.new_edges_ = &local_2a8;
  local_178.new_input_edge_ids_ = &local_1a8;
  local_320 = (pointer)g->input_edge_id_set_ids_;
  local_178.input_dimensions_ = pvVar4;
  local_178.input_crossings_ = pIVar5;
  local_178.input_ids_ = (vector<int,_std::allocator<int>_> *)local_320;
  if (((local_178.g_)->options_).edge_type_ == DIRECTED) {
    if (((local_178.g_)->options_).duplicate_edges_ == KEEP) {
      if (((local_178.g_)->options_).sibling_pairs_ == KEEP) {
        S2Builder::Graph::GetInputEdgeOrder
                  (&local_178.order_,local_178.g_,(vector<int,_std::allocator<int>_> *)local_320);
        local_218 = (undefined1  [8])0x0;
        ppStack_210 = (pair<int,_int> *)0x0;
        local_208 = (pair<int,_int> *)0x0;
        local_b0 = &local_288;
        local_b8 = (allocator_type *)&local_2f8;
        local_c0 = g;
        std::vector<int,_std::allocator<int>_>::vector
                  (local_b0,(long)pGVar20->num_vertices_,local_b8);
        if ((long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          uVar30 = (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar48 = 0;
          uVar41 = 0;
          do {
            iVar29 = (int)uVar41;
            uVar49 = (ulong)iVar29;
            if (uVar49 < uVar30) {
              piVar6 = (((_Vector_base<int,_std::allocator<int>_> *)&local_320->field_0x0)->_M_impl)
                       .super__Vector_impl_data._M_start;
              uVar39 = uVar49;
              do {
                uVar41 = uVar39;
                if (piVar6[local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar39]] !=
                    piVar6[local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar48]]) break;
                uVar39 = uVar39 + 1;
                uVar41 = uVar30;
              } while (uVar30 != uVar39);
            }
            iVar55 = (int)uVar41;
            iVar43 = iVar55 - iVar29;
            uVar48 = (ulong)iVar55;
            if (iVar43 != 1) {
              local_340 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                           *)CONCAT44(local_340._4_4_,iVar29);
              uVar30 = uVar49;
              local_348 = uVar48;
              if (iVar29 < iVar55) {
                do {
                  iVar29 = local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar30];
                  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._4_4_ = iVar29;
                  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ =
                       (pGVar20->edges_->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar29].first;
                  if (ppStack_210 == local_208) {
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_realloc_insert<std::pair<int,int>>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               local_218,(iterator)ppStack_210,(pair<int,_int> *)&local_2f8);
                  }
                  else {
                    *ppStack_210 = (pair<int,_int>)
                                   local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                    ppStack_210 = ppStack_210 + 1;
                  }
                  piVar36 = (int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                   (long)(pGVar20->edges_->
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[iVar29].second *
                                   4);
                  *piVar36 = *piVar36 + 1;
                  uVar30 = uVar30 + 1;
                  iVar43 = iVar43 + -1;
                } while (iVar43 != 0);
              }
              ppVar37 = ppStack_210;
              auVar53 = local_218;
              if (local_218 != (undefined1  [8])ppStack_210) {
                uVar48 = (long)ppStack_210 - (long)local_218 >> 3;
                lVar35 = 0x3f;
                if (uVar48 != 0) {
                  for (; uVar48 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_218,ppStack_210,((uint)lVar35 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (auVar53,ppVar37);
              }
              ppVar38 = (pGVar20->edges_->
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar30 = (ulong)((long)(pGVar20->edges_->
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar38) >>
                       3;
              uVar48 = uVar49;
              if ((int)local_340 < iVar55) {
                do {
                  uVar30 = uVar30 & 0xffffffff;
                  if (*(int *)((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start +
                              (long)ppVar38[local_178.order_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar48]].first * 4) ==
                      0) {
                    uVar30 = (ulong)(uint)local_178.order_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar48];
                  }
                  uVar48 = uVar48 + 1;
                } while (local_348 != uVar48);
              }
              do {
                local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar49] = (int)uVar30;
                iVar29 = ppVar38[(int)uVar30].second;
                *(undefined4 *)
                 ((long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)iVar29 * 4) = 0;
                uVar49 = uVar49 + 1;
                uVar48 = (long)ppStack_210 - (long)local_218 >> 3;
                auVar53 = local_218;
                if (iVar55 != (int)uVar49) {
                  while (uVar30 = uVar48, 0 < (long)uVar30) {
                    uVar48 = uVar30 >> 1;
                    ppVar37 = (pair<int,_int> *)((long)auVar53 + uVar48 * 8);
                    if ((ppVar37->first < iVar29) ||
                       ((ppVar37->first <= iVar29 && (ppVar37->second < 0)))) {
                      auVar53 = (undefined1  [8])(ppVar37 + 1);
                      uVar48 = ~uVar48 + uVar30;
                    }
                  }
                  if (iVar29 != ((pair<int,_int> *)auVar53)->first) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)&local_2f8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0xeb,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,
                               "Check failed: (v) == (out->first) ",0x22);
                    goto LAB_001a4bcf;
                  }
                  uVar30 = (ulong)(uint)((pair<int,_int> *)auVar53)->second;
                }
              } while (iVar55 != (int)uVar49);
              uVar48 = local_348;
              if ((undefined1  [8])ppStack_210 != local_218) {
                ppStack_210 = (pair<int,_int> *)local_218;
              }
            }
            uVar30 = (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
          } while (uVar48 < uVar30);
        }
        if ((pair<int,_int>)
            local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pair<int,_int>)0x0) {
          operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_218 != (undefined1  [8])0x0) {
          operator_delete((void *)local_218);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_178.rank_,
                   (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(allocator_type *)local_218);
        if ((long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar35 = (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          lVar45 = 0;
          do {
            local_178.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar45]] = (int)lVar45;
            lVar45 = lVar45 + 1;
          } while (lVar35 + (ulong)(lVar35 == 0) != lVar45);
        }
        local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_218 = (undefined1  [8])0x0;
        ppStack_210 = (pair<int,_int> *)((ulong)ppStack_210 & 0xffffffff00000000);
        local_208 = (pair<int,_int> *)0x0;
        local_200 = 0;
        local_1f8 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0;
        local_318.
        super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_318.
        super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_318.
        super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238.
        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
              *)0x0;
        local_238.
        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
              *)0x0;
        local_238.
        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
              *)0x0;
        if (local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ppVar50 = ((local_178.input_crossings_)->
                    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_c8 = "vector::_M_realloc_insert";
          uVar41 = 0;
          uVar48 = 0;
          local_a8 = 0;
          local_188 = 0;
          local_334 = 0;
          do {
            local_34c = SUB84(uVar48,0);
            local_348 = CONCAT44(local_348._4_4_,
                                 ((local_178.input_ids_)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start
                                 [local_178.order_.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar41]]);
            local_340 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                         *)(((local_178.g_)->edges_->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                           local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar41]);
            local_318.
            super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_318.
                 super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pCVar40 = local_318.
                      super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar54 = local_318.
                      super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (ppVar50 !=
                ((local_178.input_crossings_)->
                super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              do {
                if (ppVar50->first != (int)local_348) break;
                CVar2 = ppVar50->second;
                iVar29 = (int)CVar2 >> 1;
                CVar21 = local_34c;
                uVar41 = local_188;
                if (iVar29 < 0) {
                  uVar30 = (ulong)(uint)CVar2;
                  if (((iVar29 != -2) && (CVar21 = CVar2, uVar30 = local_a8, iVar29 != -1)) &&
                     (CVar21 = local_34c, uVar41 = (ulong)(uint)CVar2, iVar29 != -3)) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)&local_288,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0x165,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,
                               "Check failed: (next->second.input_id()) == (kSetReverseA) ",0x3a);
                    goto LAB_001a4bcf;
                  }
                }
                else if (pCVar40 ==
                         local_318.
                         super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  if ((long)pCVar40 - (long)pCVar54 == 0x7ffffffffffffffc) goto LAB_001a4e12;
                  uVar30 = (long)pCVar40 - (long)pCVar54 >> 2;
                  uVar41 = uVar30;
                  if (pCVar40 == pCVar54) {
                    uVar41 = 1;
                  }
                  uVar49 = uVar41 + uVar30;
                  if (0x1ffffffffffffffe < uVar49) {
                    uVar49 = 0x1fffffffffffffff;
                  }
                  if (CARRY8(uVar41,uVar30)) {
                    uVar49 = 0x1fffffffffffffff;
                  }
                  if (uVar49 == 0) {
                    pCVar23 = (pointer)0x0;
                  }
                  else {
                    pCVar23 = (pointer)operator_new(uVar49 * 4);
                  }
                  pCVar23[uVar30] = ppVar50->second;
                  pCVar16 = pCVar23;
                  for (pCVar15 = pCVar54; pCVar40 != pCVar15; pCVar15 = pCVar15 + 1) {
                    *(undefined4 *)
                     &(((_Vector_base<int,_std::allocator<int>_> *)&pCVar16->field_0x0)->_M_impl).
                      super__Vector_impl_data._M_start =
                         *(undefined4 *)
                          &(((_Vector_base<int,_std::allocator<int>_> *)&pCVar15->field_0x0)->
                           _M_impl).super__Vector_impl_data._M_start;
                    pCVar16 = pCVar16 + 1;
                  }
                  if (pCVar54 != (pointer)0x0) {
                    operator_delete(pCVar54);
                  }
                  pCVar40 = pCVar16 + 1;
                  local_318.
                  super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar23 + uVar49;
                  pCVar54 = pCVar23;
                  CVar21 = local_34c;
                  local_318.
                  super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ._M_impl.super__Vector_impl_data._M_start = pCVar23;
                  local_318.
                  super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pCVar40;
                  uVar41 = local_188;
                  uVar30 = local_a8;
                }
                else {
                  *(CrossingInputEdge *)
                   &(((_Vector_base<int,_std::allocator<int>_> *)&pCVar40->field_0x0)->_M_impl).
                    super__Vector_impl_data._M_start = CVar2;
                  pCVar40 = pCVar40 + 1;
                  local_318.
                  super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pCVar40;
                  uVar30 = local_a8;
                }
                local_a8 = uVar30;
                local_188 = uVar41;
                local_34c = CVar21;
                ppVar50 = ppVar50 + 1;
              } while (ppVar50 !=
                       ((local_178.input_crossings_)->
                       super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
            }
            pCVar40 = local_318.
                      super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            iVar29 = (int)(local_340->allocator_and_tag_).tag_.size_;
            iVar55 = *(int *)((long)&(local_340->allocator_and_tag_).tag_.size_ + 4);
            if (iVar29 == iVar55) {
              uVar41 = (long)local_318.
                             super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_318.
                             super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)(local_340->allocator_and_tag_).tag_.size_
              ;
              local_358 = (int)local_348;
              iVar7._M_current = *(pair<int,_int> **)((long)local_178.new_edges_ + 8);
              if (iVar7._M_current == *(pair<int,_int> **)((long)local_178.new_edges_ + 0x10)) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>const&>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           local_178.new_edges_,iVar7,(pair<int,_int> *)&local_288);
              }
              else {
                *iVar7._M_current =
                     (pair<int,_int>)
                     local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                *(long *)((long)local_178.new_edges_ + 8) =
                     *(long *)((long)local_178.new_edges_ + 8) + 8;
              }
              iVar8._M_current = *(int **)((long)local_178.new_input_edge_ids_ + 8);
              if (iVar8._M_current == *(int **)((long)local_178.new_input_edge_ids_ + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_178.new_input_edge_ids_,iVar8,
                           &local_358);
              }
              else {
                *iVar8._M_current = local_358;
                *(int **)((long)local_178.new_input_edge_ids_ + 8) = iVar8._M_current + 1;
              }
              uVar48 = CONCAT71((int7)(uVar48 >> 8),
                                ((uint)(uVar41 >> 2) & 1) != (uint)(local_34c._0_1_ & 1));
            }
            else {
              local_320 = local_318.
                          super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              if (local_318.
                  super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_318.
                  super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar48 = (ulong)(uint)local_34c;
                if (((uint)local_34c & 1) != 0) {
                  if ((local_188 & 1) == 0) {
                    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)(local_340->allocator_and_tag_).tag_.size_;
                  }
                  else {
                    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_ = iVar29;
                    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_ = iVar55;
                  }
                  local_358 = (int)local_348;
                  iVar7._M_current = *(pair<int,_int> **)((long)local_178.new_edges_ + 8);
                  if (iVar7._M_current == *(pair<int,_int> **)((long)local_178.new_edges_ + 0x10)) {
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_realloc_insert<std::pair<int,int>const&>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               local_178.new_edges_,iVar7,(pair<int,_int> *)&local_288);
                  }
                  else {
                    *iVar7._M_current =
                         (pair<int,_int>)
                         local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    *(long *)((long)local_178.new_edges_ + 8) =
                         *(long *)((long)local_178.new_edges_ + 8) + 8;
                  }
                  iVar8._M_current = *(int **)((long)local_178.new_input_edge_ids_ + 8);
                  if (iVar8._M_current == *(int **)((long)local_178.new_input_edge_ids_ + 0x10)) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_178.new_input_edge_ids_,
                               iVar8,&local_358);
                  }
                  else {
                    *iVar8._M_current = local_358;
                    *(int **)((long)local_178.new_input_edge_ids_ + 8) = iVar8._M_current + 1;
                  }
                  uVar48 = (ulong)(uint)local_34c;
                }
              }
              else {
                if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                }
                local_90 = ppVar50;
                if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_2f8,
                             (iterator)
                             local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)local_340);
                }
                else {
                  *local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar29;
                  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       (pointer)((long)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish + 4);
                }
                pIVar18 = local_238.
                          super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pIVar17 = local_238.
                          super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pIVar51 = local_238.
                          super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (local_238.
                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_238.
                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  do {
                    absl::
                    InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                    ::~InlinedVector(pIVar51);
                    pIVar51 = pIVar51 + 1;
                  } while (pIVar51 != pIVar18);
                  local_238.
                  super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pIVar17;
                }
                pIVar18 = local_238.
                          super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar41 = (long)pCVar40 - (long)local_320 >> 2;
                lVar45 = (long)local_238.
                               super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17 >> 3;
                uVar48 = lVar45 * -0x3333333333333333;
                lVar35 = uVar48 - uVar41;
                pIVar51 = local_238.
                          super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (uVar41 <= uVar48) {
                  if (uVar41 <= uVar48 && lVar35 != 0) {
                    for (this_01 = pIVar17 + uVar41; pIVar18 != this_01; this_01 = this_01 + 1) {
                      absl::
                      InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                      ::~InlinedVector(this_01);
                      pIVar51 = pIVar17 + uVar41;
                    }
                  }
                }
                else {
                  uVar30 = uVar41 + lVar45 * 0x3333333333333333;
                  if (uVar30 != 0) {
                    if ((ulong)(((long)local_238.
                                       super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)local_238.
                                       super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                               -0x3333333333333333) < uVar30) {
                      if (lVar45 * 0x3333333333333333 + 0x333333333333333U < uVar30) {
                        local_c8 = "vector::_M_default_append";
LAB_001a4e12:
                        std::__throw_length_error(local_c8);
                      }
                      if (uVar30 <= uVar48 && uVar48 - uVar30 != 0) {
                        uVar30 = uVar48;
                      }
                      uVar49 = uVar30 + uVar48;
                      if (0x333333333333332 < uVar49) {
                        uVar49 = 0x333333333333333;
                      }
                      if (CARRY8(uVar30,uVar48)) {
                        uVar49 = 0x333333333333333;
                      }
                      if (uVar49 == 0) {
                        local_340 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                                     *)0x0;
                      }
                      else {
                        local_340 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                                     *)operator_new(uVar49 * 0x28);
                      }
                      pAVar24 = &local_340->allocator_and_tag_ + lVar45;
                      lVar35 = uVar48 - uVar41;
                      do {
                        (pAVar24->tag_).size_ = 0;
                        pAVar24 = pAVar24 + 5;
                        lVar35 = lVar35 + 1;
                      } while (lVar35 != 0);
                      if (pIVar17 != pIVar18) {
                        pRVar52 = &local_340->rep_;
                        this_00 = pIVar17;
                        do {
                          uVar48 = (this_00->allocator_and_tag_).tag_.size_;
                          (((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                             *)((long)pRVar52 + -8))->allocator_and_tag_).tag_.size_ = uVar48;
                          if ((uVar48 & 1) == 0) {
                            if (uVar48 != 0) {
                              memcpy(pRVar52,&this_00->rep_,uVar48 << 3);
                            }
                          }
                          else {
                            uVar14 = *(undefined8 *)((long)&this_00->rep_ + 8);
                            *(undefined8 *)pRVar52 = *(undefined8 *)&this_00->rep_;
                            *(undefined8 *)((long)pRVar52 + 8) = uVar14;
                            (this_00->allocator_and_tag_).tag_.size_ = 0;
                          }
                          absl::
                          InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                          ::~InlinedVector(this_00);
                          this_00 = this_00 + 1;
                          pRVar52 = (Rep *)((long)pRVar52 + 0x28);
                        } while (this_00 != pIVar18);
                      }
                      if (pIVar17 !=
                          (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                           *)0x0) {
                        operator_delete(pIVar17);
                      }
                      local_238.
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = local_340;
                      local_238.
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_340 + uVar49;
                      pIVar51 = local_340 + uVar41;
                    }
                    else {
                      do {
                        ((local_238.
                          super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->allocator_and_tag_).tag_.
                        size_ = 0;
                        local_238.
                        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             local_238.
                             super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                        lVar35 = lVar35 + 1;
                        pIVar51 = local_238.
                                  super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      } while (lVar35 != 0);
                    }
                  }
                }
                local_238.
                super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pIVar51;
                GraphEdgeClipper::GatherIncidentEdges(&local_178,&local_2f8,0,&local_318,&local_238)
                ;
                uVar48 = (ulong)local_334;
                if (uVar48 < (ulong)((long)local_178.order_.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                     (long)local_178.order_.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start >> 2)) {
                  do {
                    if (((local_178.input_ids_)->super__Vector_base<int,_std::allocator<int>_>).
                        _M_impl.super__Vector_impl_data._M_start
                        [local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar48]] != (int)local_348) break;
                    piVar36 = &((local_178.g_)->edges_->
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_start
                               [local_178.order_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar48]].second;
                    if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_2f8,
                                 (iterator)
                                 local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,piVar36);
                    }
                    else {
                      *local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = *piVar36;
                      local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           (pointer)((long)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish + 4);
                    }
                    GraphEdgeClipper::GatherIncidentEdges
                              (&local_178,&local_2f8,
                               (int)((ulong)((long)local_2f8.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_2f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2) +
                               -1,&local_318,&local_238);
                    uVar48 = uVar48 + 1;
                  } while (uVar48 < (ulong)((long)local_178.order_.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_178.order_.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2));
                  local_334 = (int)uVar48;
                }
                if (s2builder_verbose == true) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"input edge ",0xb);
                  poVar28 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_348);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar28," (inside=",9);
                  poVar28 = std::ostream::_M_insert<bool>(SUB81(poVar28,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar28,"):",2);
                  piVar6 = local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  for (pVar42 = (pair<int,_int>)
                                local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start; pVar42 != (pair<int,_int>)piVar6;
                      pVar42 = (pair<int,_int>)((long)pVar42 + 4)) {
                    iVar29 = *(int *)pVar42;
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    std::ostream::operator<<(&std::cout,iVar29);
                  }
                }
                if (local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                }
                std::vector<int,_std::allocator<int>_>::resize
                          (local_78,(long)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2);
                local_208 = (pair<int,_int> *)local_218;
                local_200 = 0;
                std::vector<bool,_std::allocator<bool>_>::resize
                          ((vector<bool,_std::allocator<bool>_> *)local_218,
                           (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2,false);
                local_98 = (long)(int)local_348;
                local_334 = local_334 + -1;
                local_88[1] = uVar41 + (uVar41 == 0);
                lVar35 = 0;
                do {
                  if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start ==
                      local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)&local_288,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0x218,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,"Check failed: !a.empty() ",0x19);
                    goto LAB_001a4bcf;
                  }
                  pIVar51 = local_238.
                            super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar35;
                  uVar41 = (pIVar51->allocator_and_tag_).tag_.size_;
                  if (uVar41 < 2) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)&local_288,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0x219,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,"Check failed: !b.empty() ",0x19);
                    goto LAB_001a4bcf;
                  }
                  local_340 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                               *)CONCAT71(local_340._1_7_,*(undefined1 *)(local_320 + lVar35));
                  uVar48 = (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  dVar56 = 0.0;
                  iVar29 = (int)(uVar48 >> 2);
                  local_a0 = lVar35;
                  if (iVar29 != 1) {
                    pRVar52 = &pIVar51->rep_;
                    pRVar31 = pRVar52;
                    if ((uVar41 & 1) != 0) {
                      pRVar31 = *(Rep **)((long)&pIVar51->rep_ + 8);
                    }
                    iVar55 = *(int *)((long)pRVar31 + 4);
                    pCVar25 = absl::
                              InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                              ::back(pIVar51);
                    uVar41 = (pIVar51->allocator_and_tag_).tag_.size_;
                    if (iVar55 == pCVar25->a_index) {
                      if (uVar41 < 2) {
LAB_001a4de4:
                        __assert_fail("i < size()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                                      ,0xf8,
                                      "const_reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::operator[](size_type) const [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>]"
                                     );
                      }
                      if ((uVar41 & 1) != 0) {
                        pRVar52 = *(Rep **)((long)&pIVar51->rep_ + 8);
                      }
                      dVar56 = (double)(ulong)*(uint *)((long)pRVar52 + 4);
                    }
                    else {
                      if (uVar41 < 2) goto LAB_001a4de4;
                      pRVar31 = pRVar52;
                      if ((uVar41 & 1) != 0) {
                        pRVar31 = *(Rep **)((long)&pIVar51->rep_ + 8);
                      }
                      iVar55 = (*(byte *)((long)pRVar31 + 8) ^ 1) +
                               local_178.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start[*(int *)pRVar31];
                      pCVar25 = absl::
                                InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                                ::back(pIVar51);
                      uVar41 = (pIVar51->allocator_and_tag_).tag_.size_;
                      pRVar31 = pRVar52;
                      if ((uVar41 & 1) != 0) {
                        pRVar31 = *(Rep **)((long)&pIVar51->rep_ + 8);
                      }
                      local_180 = (pCVar25->outgoing ^ 1) +
                                  local_178.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[pCVar25->id];
                      local_220 = (ulong)((long)local_178.order_.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_178.order_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2;
                      uVar44 = 0xffffffff;
                      local_328 = pRVar52;
                      local_17c = iVar55;
                      if (uVar41 < 2) {
                        local_330 = 2.12199579047121e-314;
                        local_354 = 0xffffffff;
                      }
                      else {
                        cVar46 = local_180 < iVar55;
                        lVar35 = (uVar41 >> 1) << 4;
                        local_354 = 0xffffffff;
                        lVar45 = 0;
                        local_330 = 2.12199579047121e-314;
                        local_34d = cVar46;
                        local_88[0] = lVar35;
                        do {
                          iVar55 = *(int *)((long)pRVar31 + lVar45 + 4);
                          lVar26 = (long)iVar55;
                          if (lVar26 == 0) {
                            if ((*(char *)((long)pRVar31 + lVar45 + 8) != cVar46) &&
                               (*(int *)((long)pRVar31 + lVar45 + 0xc) !=
                                *(int *)((long)local_2f8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + 4))) {
                              local_330 = (double)(ulong)*(uint *)((long)pRVar31 + lVar45);
                            }
                          }
                          else if (iVar55 == iVar29 + -1) {
                            if ((*(char *)((long)pRVar31 + lVar45 + 8) == cVar46) &&
                               (*(int *)((long)pRVar31 + lVar45 + 0xc) !=
                                *(int *)((long)local_2f8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start +
                                        ((long)(uVar48 * 0x40000000 + -0x200000000) >> 0x1e)))) {
                              uVar44 = *(uint *)((long)pRVar31 + lVar45);
                            }
                          }
                          else {
                            iVar55 = *(int *)((long)pRVar31 + lVar45 + 0xc);
                            if ((iVar55 != ((int *)((long)local_2f8.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + -4))
                                           [lVar26]) &&
                               (iVar55 != ((int *)((long)local_2f8.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4))
                                          [lVar26])) {
                              pVVar9 = ((local_178.g_)->vertices_->
                                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start;
                              bVar22 = s2pred::OrderedCCW(pVVar9 + ((int *)((long)local_2f8.
                                                                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4))
                                                  [lVar26],pVVar9 + iVar55,
                                                  pVVar9 + ((int *)((long)local_2f8.
                                                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + -4))
                                                  [lVar26],pVVar9 + *(int *)((long)local_2f8.
                                                                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                  lVar26 * 4));
                              uVar47 = local_178.rank_.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [*(int *)((long)pRVar31 + lVar45)];
                              lVar35 = local_88[0];
                              cVar46 = local_34d;
                              if (((bVar22 ^ (byte)local_340) & 1) == 0) {
                                if ((int)local_354 <= (int)(uVar47 + 1)) {
                                  local_354 = uVar47 + 1;
                                }
                              }
                              else {
                                iVar55 = (int)local_220;
                                local_220 = local_220 & 0xffffffff;
                                if ((int)uVar47 < iVar55) {
                                  local_220 = (ulong)uVar47;
                                }
                              }
                            }
                          }
                          lVar45 = lVar45 + 0x10;
                        } while (lVar35 != lVar45);
                      }
                      iVar29 = (int)local_220;
                      pRVar52 = local_328;
                      uVar47 = local_354;
                      if ((-1 < SUB84(local_330,0)) && (-1 < (int)uVar44)) {
                        uVar41 = (pIVar51->allocator_and_tag_).tag_.size_;
                        pRVar31 = local_328;
                        if ((uVar41 & 1) != 0) {
                          pRVar31 = *(Rep **)((long)&pIVar51->rep_ + 8);
                        }
                        uVar48 = (ulong)((long)local_178.order_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)local_178.order_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2;
                        iVar55 = (int)uVar48;
                        uVar33 = 0xffffffff;
                        if (1 < uVar41) {
                          piVar36 = (int *)((long)pRVar31 + (uVar41 & 0xfffffffffffffffe) * 8);
                          uVar33 = 0xffffffff;
                          do {
                            uVar34 = (*(byte *)((long)pRVar31 + 8) ^ 1) +
                                     local_178.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[*(int *)pRVar31];
                            iVar55 = (int)uVar48;
                            uVar48 = uVar48 & 0xffffffff;
                            if ((int)uVar34 < iVar55) {
                              uVar48 = (ulong)uVar34;
                            }
                            iVar55 = (int)uVar48;
                            if ((int)uVar34 < (int)uVar33) {
                              uVar34 = uVar33;
                            }
                            uVar33 = uVar34;
                            pRVar31 = (Rep *)((long)pRVar31 + 0x10);
                          } while (pRVar31 != (Rep *)piVar36);
                        }
                        if (((int)local_354 <= iVar55) && ((int)uVar33 <= iVar29)) {
                          uVar41 = (ulong)uVar44;
                          if (local_180 < local_17c) {
                            uVar41 = (ulong)local_330 & 0xffffffff;
                          }
                          uVar48 = (ulong)local_330 & 0xffffffff;
                          if (local_180 < local_17c) {
                            uVar48 = (ulong)uVar44;
                          }
                          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          lVar35 = (long)local_178.rank_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar48];
                          if (local_178.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar48] <
                              local_178.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar41]) {
                            do {
                              piVar36 = &((local_178.g_)->edges_->
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start
                                         [local_178.order_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[lVar35]].second;
                              if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish ==
                                  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage) {
                                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                          ((vector<int,std::allocator<int>> *)&local_288,
                                           (iterator)
                                           local_288.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish,piVar36);
                              }
                              else {
                                *local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish = *piVar36;
                                local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish =
                                     (pointer)((long)local_288.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_finish + 4);
                              }
                              lVar35 = lVar35 + 1;
                            } while (lVar35 < local_178.rank_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar41]);
                          }
                          if ((((local_178.g_)->edges_->
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar41].second !=
                               *local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) &&
                             (pVar32 = (pair<int,_int>)
                                       ((long)local_288.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish + -4),
                             pVar42 = (pair<int,_int>)
                                      local_288.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start < (ulong)pVar32 &&
                             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start !=
                             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish)) {
                            do {
                              pVar27 = (pair<int,_int>)((long)pVar42 + 4);
                              uVar3 = *(undefined4 *)pVar42;
                              *(undefined4 *)pVar42 = *(undefined4 *)pVar32;
                              *(undefined4 *)pVar32 = uVar3;
                              pVar32 = (pair<int,_int>)((long)pVar32 + -4);
                              pVar42 = pVar27;
                            } while ((ulong)pVar27 < (ulong)pVar32);
                          }
                          std::vector<int,std::allocator<int>>::
                          _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                    ((vector<int,std::allocator<int>> *)&local_288,
                                     local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish,
                                     local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start,
                                     local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish);
                          lVar35 = 0;
                          do {
                            std::vector<int,_std::allocator<int>_>::insert
                                      (&local_288,
                                       (const_iterator)
                                       local_288.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,
                                       (value_type_conflict2 *)
                                       ((long)local_288.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + lVar35));
                            pRVar52 = local_328;
                            lVar35 = lVar35 + 4;
                          } while (lVar35 == 4);
                          if ((ulong)((long)local_288.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_288.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start) < 9) {
                            bVar22 = false;
                          }
                          else {
                            dVar56 = 0.0;
                            uVar30 = 2;
                            do {
                              pVVar9 = ((local_178.g_)->vertices_->
                                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start;
                              local_330 = dVar56;
                              dVar56 = S2::TurnAngle(pVVar9 + (int)((undefined4 *)
                                                                   ((long)local_288.
                                                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + -8))
                                                  [uVar30],pVVar9 + (int)((undefined4 *)
                                                                         ((long)local_288.
                                                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + -4))
                                                  [uVar30],pVVar9 + *(int *)((long)local_288.
                                                                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                  uVar30 * 4));
                              dVar56 = local_330 + dVar56;
                              uVar30 = uVar30 + 1;
                            } while (uVar30 < (ulong)((long)local_288.
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_288.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2));
                            bVar22 = 0.0 < dVar56;
                          }
                          if ((pair<int,_int>)
                              local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
                            operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                          }
                          uVar47 = local_354;
                          if (((bVar22 ^ (byte)local_340) & 1) == 0) {
                            if ((int)local_354 <=
                                (int)(local_178.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar41] + 1U)) {
                              uVar47 = local_178.rank_.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar41] + 1U;
                            }
                          }
                          else if (local_178.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar48] < iVar29) {
                            iVar29 = local_178.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar48];
                          }
                        }
                      }
                      if (iVar29 < (int)uVar47) {
                        S2LogMessage::S2LogMessage
                                  ((S2LogMessage *)&local_288,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                                   ,0x293,kFatal,(ostream *)&std::cerr);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,"Check failed: (lo) <= (hi) ",
                                   0x1b);
                        goto LAB_001a4bcf;
                      }
                      uVar41 = (pIVar51->allocator_and_tag_).tag_.size_;
                      if ((uVar41 & 1) != 0) {
                        pRVar52 = *(Rep **)((long)&pIVar51->rep_ + 8);
                      }
                      dVar56 = 2.12199579047121e-314;
                      if (1 < uVar41) {
                        lVar35 = 0;
                        do {
                          iVar55 = (*(byte *)((long)pRVar52 + lVar35 + 8) ^ 1) +
                                   local_178.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [*(int *)((long)pRVar52 + lVar35)];
                          if ((((int)uVar47 <= iVar55) && (iVar55 <= iVar29)) &&
                             ((uVar44 = *(uint *)((long)pRVar52 + lVar35 + 4), SUB84(dVar56,0) < 0
                              || (*(int *)((long)local_2f8.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start +
                                          (long)(int)uVar44 * 4) <
                                  *(int *)((long)local_2f8.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start +
                                          (long)dVar56 * 4))))) {
                            dVar56 = (double)(ulong)uVar44;
                          }
                          lVar35 = lVar35 + 0x10;
                        } while ((uVar41 >> 1) * 0x10 != lVar35);
                      }
                    }
                  }
                  uVar44 = SUB84(dVar56,0);
                  if ((int)uVar44 < 0) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)&local_288,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0x1ba,kFatal,(ostream *)&std::cerr);
                    std::operator<<((ostream *)
                                    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,
                                    "Failed to get crossed vertex index.");
                    goto LAB_001a4bcf;
                  }
                  local_354 = uVar44;
                  local_330 = dVar56;
                  if (s2builder_verbose == true) {
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
                    std::ostream::put('P');
                    poVar28 = (ostream *)std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"  ",2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"b input edge ",0xd);
                    poVar28 = (ostream *)
                              std::ostream::operator<<(poVar28,(int)local_320[local_a0] >> 1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar28," (l2r=",6);
                    poVar28 = std::ostream::_M_insert<bool>(SUB81(poVar28,0));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar28,", crossing=",0xb);
                    poVar28 = (ostream *)
                              std::ostream::operator<<
                                        (poVar28,*(int *)((long)local_2f8.
                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                  (long)local_330 * 4));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar28,")",1);
                    uVar41 = (pIVar51->allocator_and_tag_).tag_.size_;
                    if ((uVar41 & 1) == 0) {
                      pRVar52 = &pIVar51->rep_;
                    }
                    else {
                      pRVar52 = *(Rep **)((long)&pIVar51->rep_ + 8);
                    }
                    if (1 < uVar41) {
                      lVar35 = 0;
                      do {
                        iVar29 = *(int *)((long)pRVar52 + lVar35);
                        ppVar38 = ((local_178.g_)->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout," (",2);
                        poVar28 = (ostream *)
                                  std::ostream::operator<<(&std::cout,ppVar38[iVar29].first);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar28,", ",2);
                        poVar28 = (ostream *)
                                  std::ostream::operator<<(poVar28,ppVar38[iVar29].second);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar28,")",1);
                        lVar35 = lVar35 + 0x10;
                      } while ((uVar41 >> 1) * 0x10 != lVar35);
                    }
                  }
                  uVar44 = (((byte)local_340 ^ (byte)local_a8) & 1) - 1 | 1;
                  if (((local_178.input_dimensions_)->
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                      super__Vector_impl_data._M_start[(int)local_320[local_a0] >> 1] == '\x01') {
                    uVar44 = 0;
                  }
                  local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_330] =
                       local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)local_330] + uVar44;
                  *(pair<int,_int> *)((long)local_218 + (ulong)(local_354 >> 6) * 8) =
                       (pair<int,_int>)
                       ((ulong)*(pair<int,_int> *)((long)local_218 + (ulong)(local_354 >> 6) * 8) |
                       1L << ((byte)local_354 & 0x3f));
                  lVar35 = local_a0 + 1;
                } while (lVar35 != local_88[1]);
                if (s2builder_verbose != false) {
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
                  std::ostream::put('P');
                  std::ostream::flush();
                }
                uVar48 = (ulong)((uint)(local_34c._0_1_ & 1) +
                                *local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                if (4 < (ulong)((long)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start)) {
                  uVar41 = 1;
                  do {
                    iVar29 = (int)uVar48;
                    if (iVar29 != 0) {
                      bVar13 = (byte)uVar41 & 0x3f;
                      *(pair<int,_int> *)((long)local_218 + (uVar41 >> 6) * 8) =
                           (pair<int,_int>)
                           ((ulong)*(pair<int,_int> *)((long)local_218 + (uVar41 >> 6) * 8) &
                           (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13));
                      uVar30 = uVar41 - 1;
                      bVar13 = (byte)uVar30 & 0x3f;
                      *(pair<int,_int> *)
                       ((long)local_218 +
                       ((uVar30 >> 6) +
                       ((ulong)((uVar30 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
                           (pair<int,_int>)
                           ((ulong)*(pair<int,_int> *)
                                    ((long)local_218 +
                                    ((uVar30 >> 6) +
                                    ((ulong)((uVar30 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    )) * 8) & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13)
                           );
                    }
                    uVar30 = (ulong)(uint)-iVar29;
                    if ((local_188 & 1) == 0) {
                      uVar30 = uVar48;
                    }
                    uVar48 = uVar30;
                    if (0 < (int)uVar30) {
                      do {
                        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start =
                             *(pointer *)
                              ((int *)((long)local_2f8.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + -4) +
                              uVar41);
                        local_358 = (int)local_348;
                        iVar7._M_current = *(pair<int,_int> **)((long)local_178.new_edges_ + 8);
                        if (iVar7._M_current ==
                            *(pair<int,_int> **)((long)local_178.new_edges_ + 0x10)) {
                          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                          _M_realloc_insert<std::pair<int,int>const&>
                                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>
                                      *)local_178.new_edges_,iVar7,(pair<int,_int> *)&local_288);
                        }
                        else {
                          *iVar7._M_current =
                               (pair<int,_int>)
                               local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                          *(long *)((long)local_178.new_edges_ + 8) =
                               *(long *)((long)local_178.new_edges_ + 8) + 8;
                        }
                        iVar8._M_current = *(int **)((long)local_178.new_input_edge_ids_ + 8);
                        if (iVar8._M_current ==
                            *(int **)((long)local_178.new_input_edge_ids_ + 0x10)) {
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    ((vector<int,std::allocator<int>> *)
                                     local_178.new_input_edge_ids_,iVar8,&local_358);
                        }
                        else {
                          *iVar8._M_current = local_358;
                          *(int **)((long)local_178.new_input_edge_ids_ + 8) = iVar8._M_current + 1;
                        }
                        uVar44 = (int)uVar48 - 1;
                        uVar48 = (ulong)uVar44;
                      } while (uVar44 != 0);
                    }
                    if ((int)uVar30 < 0) {
                      do {
                        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_ =
                             ((int *)((long)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + -4))[uVar41];
                        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_ =
                             *(int *)((long)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + uVar41 * 4);
                        local_358 = (int)local_348;
                        iVar7._M_current = *(pair<int,_int> **)((long)local_178.new_edges_ + 8);
                        if (iVar7._M_current ==
                            *(pair<int,_int> **)((long)local_178.new_edges_ + 0x10)) {
                          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                          _M_realloc_insert<std::pair<int,int>const&>
                                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>
                                      *)local_178.new_edges_,iVar7,(pair<int,_int> *)&local_288);
                        }
                        else {
                          *iVar7._M_current =
                               (pair<int,_int>)
                               local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                          *(long *)((long)local_178.new_edges_ + 8) =
                               *(long *)((long)local_178.new_edges_ + 8) + 8;
                        }
                        iVar8._M_current = *(int **)((long)local_178.new_input_edge_ids_ + 8);
                        if (iVar8._M_current ==
                            *(int **)((long)local_178.new_input_edge_ids_ + 0x10)) {
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    ((vector<int,std::allocator<int>> *)
                                     local_178.new_input_edge_ids_,iVar8,&local_358);
                        }
                        else {
                          *iVar8._M_current = local_358;
                          *(int **)((long)local_178.new_input_edge_ids_ + 8) = iVar8._M_current + 1;
                        }
                        uVar44 = (int)uVar30 + 1;
                        uVar30 = (ulong)uVar44;
                      } while (uVar44 != 0);
                    }
                    uVar48 = (ulong)(uint)(iVar29 + local_78[0].
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar41]
                                          );
                    uVar41 = uVar41 + 1;
                  } while (uVar41 < (ulong)((long)local_2f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_2f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2));
                }
                ppVar50 = local_90;
                if (1 < (uint)uVar48) {
                  S2LogMessage::S2LogMessage
                            ((S2LogMessage *)&local_288,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                             ,0x1d6,kFatal,(ostream *)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             "Check failed: multiplicity == 0 || multiplicity == 1 ",0x35);
                  goto LAB_001a4bcf;
                }
                if ((((local_178.input_dimensions_)->
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                     super__Vector_impl_data._M_start[local_98] != '\0') &&
                   (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start)) {
                  uVar41 = 0;
                  do {
                    if (((ulong)*(pair<int,_int> *)((long)local_218 + (uVar41 >> 6) * 8) >>
                         (uVar41 & 0x3f) & 1) != 0) {
                      iVar29 = *(int *)((long)local_2f8.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + uVar41 * 4);
                      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_ = iVar29;
                      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_ = iVar29;
                      local_358 = (int)local_348;
                      iVar7._M_current = *(pair<int,_int> **)((long)local_178.new_edges_ + 8);
                      if (iVar7._M_current ==
                          *(pair<int,_int> **)((long)local_178.new_edges_ + 0x10)) {
                        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                        _M_realloc_insert<std::pair<int,int>const&>
                                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                   local_178.new_edges_,iVar7,(pair<int,_int> *)&local_288);
                      }
                      else {
                        *iVar7._M_current =
                             (pair<int,_int>)
                             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                        *(long *)((long)local_178.new_edges_ + 8) =
                             *(long *)((long)local_178.new_edges_ + 8) + 8;
                      }
                      iVar8._M_current = *(int **)((long)local_178.new_input_edge_ids_ + 8);
                      if (iVar8._M_current == *(int **)((long)local_178.new_input_edge_ids_ + 0x10))
                      {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)local_178.new_input_edge_ids_,
                                   iVar8,&local_358);
                      }
                      else {
                        *iVar8._M_current = local_358;
                        *(int **)((long)local_178.new_input_edge_ids_ + 8) = iVar8._M_current + 1;
                      }
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar41 < (ulong)((long)local_2f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_2f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2));
                }
              }
            }
            local_334 = local_334 + 1;
            uVar41 = (ulong)local_334;
          } while (uVar41 < (ulong)((long)local_178.order_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                    (long)local_178.order_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start >> 2));
        }
        std::
        vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ::~vector(&local_238);
        if (local_318.
            super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_318.
                          super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_218 != (undefined1  [8])0x0) {
          operator_delete((void *)local_218);
          local_218 = (undefined1  [8])0x0;
          ppStack_210 = (pair<int,_int> *)((ulong)ppStack_210 & 0xffffffff00000000);
          local_208 = (pair<int,_int> *)0x0;
          local_200 = 0;
          local_1f8 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0;
        }
        if (local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (int *)0x0) {
          operator_delete(local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pair<int,_int>)
            local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pair<int,_int>)0x0) {
          operator_delete(local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_178.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_178.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_178.in_.in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.in_.in_edge_begins_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_178.in_.in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.in_.in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (s2builder_verbose == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Edges after clipping: ",0x16);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          if (local_2a8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              local_2a8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            uVar41 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
              poVar28 = (ostream *)
                        std::ostream::operator<<
                                  (&std::cout,
                                   local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar41]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar28," (",2);
              poVar28 = (ostream *)
                        std::ostream::operator<<
                                  (poVar28,local_2a8.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar41].first);
              std::__ostream_insert<char,std::char_traits<char>>(poVar28,", ",2);
              poVar28 = (ostream *)
                        std::ostream::operator<<
                                  (poVar28,local_2a8.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar41].second)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar28,")",1);
              std::ios::widen((char)poVar28->_vptr_basic_ostream[-3] + (char)poVar28);
              std::ostream::put((char)poVar28);
              std::ostream::flush();
              uVar41 = uVar41 + 1;
            } while (uVar41 < (ulong)((long)local_2a8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2a8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        IdSetLexicon::IdSetLexicon((IdSetLexicon *)&local_178);
        pvVar10 = local_290->layers_;
        lVar35 = (long)(pvVar10->
                       super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar10->
                       super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3;
        if (lVar35 == 1) {
          (**(code **)(*(long *)(((pvVar10->
                                  super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                                ._M_t + 0x10))(&local_288);
          pSVar19 = local_190;
          MakeGraph((Graph *)local_218,local_c0,(GraphOptions *)&local_288,&local_2a8,&local_1a8,
                    (IdSetLexicon *)&local_178,local_190);
          _Var11._M_t.
          super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
          super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
               (((local_290->layers_->
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>._M_t;
          (**(code **)(*(long *)_Var11._M_t.
                                super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                                .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl +
                      0x18))(_Var11._M_t.
                             super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                             .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                             local_218,pSVar19);
          if (local_1c0 != (_Manager_type)0x0) {
            (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
          }
        }
        else {
          if (lVar35 != 3) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)local_218,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                       ,0x30a,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppStack_210,"Check failed: (3) == (layers_.size()) ",0x26);
            goto LAB_001a4bcf;
          }
          local_258 = 0;
          uStack_250 = 0;
          local_268 = 0;
          uStack_260 = 0;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          uStack_270 = 0;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_248 = 0;
          local_2b8 = 0;
          local_2c8 = 0;
          uStack_2c0 = 0;
          local_2d8 = 0;
          uStack_2d0 = 0;
          local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          uStack_2e0 = 0;
          local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          lVar35 = 0x10;
          do {
            *(undefined8 *)((long)local_88 + lVar35) = 0x200000000;
            *(undefined8 *)((long)local_88 + lVar35 + 8) = 0x200000001;
            *(undefined1 *)
             ((long)&local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar35) = 1;
            lVar35 = lVar35 + 0x14;
          } while (lVar35 != 0x4c);
          local_318.
          super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_318.
          super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_318.
          super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::reserve
                    ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&local_318,3);
          ppVar38 = local_2a8.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_2a8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              local_2a8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            lVar35 = 0;
            lVar45 = 0;
            uVar41 = 0;
            do {
              cVar46 = (local_290->input_dimensions_->
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                       super__Vector_impl_data._M_start
                       [*(int *)((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar45)];
              ppVar37 = (pair<int,_int> *)
                        ((long)&(local_2a8.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar35);
              iVar7._M_current =
                   (pair<int,_int> *)
                   (&local_288)[cVar46].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (pair<int,_int> *)
                  (&local_288)[cVar46].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>const&>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           (&local_288 + cVar46),iVar7,ppVar37);
              }
              else {
                *iVar7._M_current = *ppVar37;
                ppiVar1 = &(&local_288)[cVar46].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppiVar1 = *ppiVar1 + 2;
              }
              iVar8._M_current =
                   (&local_2f8)[cVar46].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (&local_2f8)[cVar46].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)(&local_2f8 + cVar46),iVar8,
                           (int *)((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar45));
              }
              else {
                *iVar8._M_current =
                     *(int *)((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar45);
                (&local_2f8)[cVar46].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
              uVar41 = uVar41 + 1;
              lVar45 = lVar45 + 4;
              lVar35 = lVar35 + 8;
              ppVar38 = local_2a8.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar41 < (ulong)((long)local_2a8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2a8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          local_2a8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppVar38 != (pointer)0x0) {
            operator_delete(ppVar38);
          }
          piVar6 = local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          if (piVar6 != (pointer)0x0) {
            operator_delete(piVar6);
          }
          options = (GraphOptions *)local_78;
          lVar35 = 0;
          lVar45 = 0;
          do {
            (**(code **)(*(long *)(local_290->layers_->
                                  super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar45]._M_t.
                                  super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                                  ._M_t + 0x10))((Graph *)local_218);
            options->allow_vertex_filtering_ = local_208._0_1_;
            options->edge_type_ = local_218._0_4_;
            options->degenerate_edges_ = local_218._4_4_;
            *(pair<int,_int> **)&options->duplicate_edges_ = ppStack_210;
            MakeGraph((Graph *)local_218,local_c0,options,
                      (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_b0
                      ,(vector<int,_std::allocator<int>_> *)local_b8,(IdSetLexicon *)&local_178,
                      local_190);
            std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::
            emplace_back<S2Builder::Graph>
                      ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&local_318,
                       (Graph *)local_218);
            if (local_1c0 != (_Manager_type)0x0) {
              (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
            }
            _Var11._M_t.
            super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
            super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
                 (local_290->layers_->
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar45]._M_t.
                 super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>.
                 _M_t;
            (**(code **)(*(long *)_Var11._M_t.
                                  super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                                  .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl +
                        0x18))(_Var11._M_t.
                               super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                               .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                               (long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                       &(local_318.
                                         super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->field_0x0)->
                                      _M_impl).super__Vector_impl_data._M_start + lVar35,local_190);
            lVar45 = lVar45 + 1;
            local_b8 = local_b8 + 0x18;
            local_b0 = local_b0 + 1;
            options = options + 1;
            lVar35 = lVar35 + 0x68;
          } while (lVar45 != 3);
          std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector
                    ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&local_318);
          lVar35 = 0x30;
          do {
            pvVar12 = *(void **)((long)&local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar35);
            if (pvVar12 != (void *)0x0) {
              operator_delete(pvVar12);
            }
            lVar35 = lVar35 + -0x18;
          } while (lVar35 != -0x18);
          lVar35 = 0x30;
          do {
            pvVar12 = *(void **)((long)&local_288.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar35);
            if (pvVar12 != (void *)0x0) {
              operator_delete(pvVar12);
            }
            lVar35 = lVar35 + -0x18;
          } while (lVar35 != -0x18);
        }
        IdSetLexicon::~IdSetLexicon((IdSetLexicon *)&local_178);
        if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_2a8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a8.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_218,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0xc1,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppStack_210,
                 "Check failed: g.options().sibling_pairs() == SiblingPairs::KEEP ",0x40);
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_218,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0xc0,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppStack_210,
                 "Check failed: g.options().duplicate_edges() == DuplicateEdges::KEEP ",0x44);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_218,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0xbf,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppStack_210,"Check failed: g.options().edge_type() == EdgeType::DIRECTED "
               ,0x3c);
  }
LAB_001a4bcf:
  abort();
}

Assistant:

void EdgeClippingLayer::Build(const Graph& g, S2Error* error) {
  // The bulk of the work is handled by GraphEdgeClipper.
  vector<Graph::Edge> new_edges;
  vector<InputEdgeIdSetId> new_input_edge_ids;
  // Destroy the GraphEdgeClipper immediately to save memory.
  GraphEdgeClipper(g, input_dimensions_, input_crossings_,
                   &new_edges, &new_input_edge_ids).Run();
  if (s2builder_verbose) {
    std::cout << "Edges after clipping: " << std::endl;
    for (int i = 0; i < new_edges.size(); ++i) {
      std::cout << "  " << new_input_edge_ids[i] << " (" << new_edges[i].first
                << ", " << new_edges[i].second << ")" << std::endl;
    }
  }
  // Construct one or more graphs from the clipped edges and pass them to the
  // given output layer(s).
  IdSetLexicon new_input_edge_id_set_lexicon;
  if (layers_.size() == 1) {
    GraphOptions options = layers_[0]->graph_options();
    Graph new_graph = MakeGraph(g, &options, &new_edges, &new_input_edge_ids,
                                &new_input_edge_id_set_lexicon, error);
    layers_[0]->Build(new_graph, error);
  } else {
    // The Graph objects must be valid until the last Build() call completes,
    // so we store all of the graph data in arrays with 3 elements.
    S2_DCHECK_EQ(3, layers_.size());
    vector<Graph::Edge> layer_edges[3];
    vector<InputEdgeIdSetId> layer_input_edge_ids[3];
    S2Builder::GraphOptions layer_options[3];
    vector<S2Builder::Graph> layer_graphs;  // No default constructor.
    layer_graphs.reserve(3);
    // Separate the edges according to their dimension.
    for (int i = 0; i < new_edges.size(); ++i) {
      int d = input_dimensions_[new_input_edge_ids[i]];
      layer_edges[d].push_back(new_edges[i]);
      layer_input_edge_ids[d].push_back(new_input_edge_ids[i]);
    }
    // Clear variables to save space.
    vector<Graph::Edge>().swap(new_edges);
    vector<InputEdgeIdSetId>().swap(new_input_edge_ids);
    for (int d = 0; d < 3; ++d) {
      layer_options[d] = layers_[d]->graph_options();
      layer_graphs.push_back(MakeGraph(
          g, &layer_options[d], &layer_edges[d], &layer_input_edge_ids[d],
          &new_input_edge_id_set_lexicon, error));
      layers_[d]->Build(layer_graphs[d], error);
    }
  }
}